

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O2

void Sparkle(byte red,byte green,byte blue,int SpeedDelay)

{
  int ledIndex;
  
  ledIndex = myRandom(0,0x18);
  setPixel(ledIndex,red,green,blue);
  showStrip();
  delay(SpeedDelay);
  setPixel(ledIndex,'\0','\0','\0');
  return;
}

Assistant:

void Sparkle(byte red, byte green, byte blue, int SpeedDelay) {
    int Pixel =myRandom(0, NUM_LEDS);
    setPixel(Pixel,red,green,blue);
    showStrip();
    delay(SpeedDelay);
    setPixel(Pixel,0,0,0);
}